

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.h
# Opt level: O2

void __thiscall Game::Game(Game *this,vector<Player,_std::allocator<Player>_> *players)

{
  allocator_type local_41;
  _Vector_base<int,_std::allocator<int>_> local_40;
  
  std::vector<Player,_std::allocator<Player>_>::vector(&this->m_players,players);
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_allCards).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_playerCards).
  super__Vector_base<std::vector<Card,_std::allocator<Card>_>,_std::allocator<std::vector<Card,_std::allocator<Card>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_playerPoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->m_teams).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  Ruleset::Ruleset(&this->m_rules);
  initializeCards(this);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_40,4,&local_41);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->m_playerPoints,&local_40);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

explicit Game(std::vector<Player> &players) : m_players(players) {
        initializeCards();
        m_playerPoints = std::vector<int>(4);
    }